

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O2

CURLcode Curl_rand(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  int __fd;
  ssize_t sVar2;
  ulong uVar3;
  ulong uVar4;
  curltime cVar5;
  uint r;
  Curl_easy *local_38;
  
  CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
  local_38 = data;
  do {
    if (num == 0) {
      return CVar1;
    }
    uVar4 = 4;
    if (num < 4) {
      uVar4 = num;
    }
    CVar1 = Curl_ssl_random(local_38,(uchar *)&r,4);
    uVar3 = uVar4;
    if (CVar1 != CURLE_OK) {
      if (CVar1 != CURLE_NOT_BUILT_IN) {
        return CVar1;
      }
      if (randit_seeded == '\0') {
        __fd = open64("/dev/urandom",0);
        if (-1 < __fd) {
          sVar2 = read(__fd,&randit_randseed,4);
          if (sVar2 == 4) {
            randit_seeded = '\x01';
          }
          close(__fd);
        }
        if (randit_seeded == '\0') {
          cVar5 = Curl_now();
          Curl_infof(local_38,"WARNING: Using weak random seed\n");
          randit_randseed =
               ((int)cVar5.tv_sec + cVar5.tv_usec + randit_randseed) * -0x7f82434b + 0xa70427df;
          randit_seeded = '\x01';
        }
      }
      randit_randseed = randit_randseed * 0x41c64e6d + 0x3039;
      r = randit_randseed * 0x10000 | randit_randseed >> 0x10;
    }
    while (uVar3 != 0) {
      *rnd = (uchar)r;
      rnd = rnd + 1;
      r = r >> 8;
      uVar3 = uVar3 - 1;
    }
    num = num - uVar4;
    CVar1 = CURLE_OK;
  } while( true );
}

Assistant:

CURLcode Curl_rand(struct Curl_easy *data, unsigned char *rnd, size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;

  DEBUGASSERT(num > 0);

  while(num) {
    unsigned int r;
    size_t left = num < sizeof(unsigned int) ? num : sizeof(unsigned int);

    result = randit(data, &r);
    if(result)
      return result;

    while(left) {
      *rnd++ = (unsigned char)(r & 0xFF);
      r >>= 8;
      --num;
      --left;
    }
  }

  return result;
}